

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,REF_CLOUD *one_layer,REF_NODE ref_node)

{
  uint uVar1;
  REF_DBL local_a8;
  REF_GLOB local_a0;
  REF_GLOB local_98;
  REF_DBL local_90;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyzs [4];
  REF_GLOB global_pivot;
  REF_GLOB global;
  int local_40;
  REF_INT i;
  REF_INT add_index;
  REF_INT local_pivot;
  REF_INT pivot_index;
  REF_STATUS ref_status;
  REF_CLOUD copy;
  REF_NODE ref_node_local;
  REF_CLOUD *one_layer_local;
  REF_CLOUD ref_cloud_local;
  
  copy = (REF_CLOUD)ref_node;
  ref_node_local = (REF_NODE)one_layer;
  one_layer_local = (REF_CLOUD *)ref_cloud;
  uVar1 = ref_cloud_deep_copy((REF_CLOUD *)&pivot_index,ref_cloud);
  if (uVar1 == 0) {
    add_index = 0;
    if (_pivot_index->n < 1) {
      local_90 = -NAN;
    }
    else {
      local_90 = (REF_DBL)*_pivot_index->global;
    }
    xyzs[3] = local_90;
    while (add_index < _pivot_index->n) {
      uVar1 = ::ref_node_local((REF_NODE)copy,(REF_GLOB)xyzs[3],&i);
      local_pivot = uVar1;
      if (uVar1 == 5) {
        printf("global %ld not found\n",xyzs[3]);
      }
      else {
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x3ad,"ref_recon_grow_cloud_one_layer",(ulong)uVar1,"local search");
          return uVar1;
        }
        local_40 = 0;
        if (**(int **)(&ref_node_local->n + (long)i * 2) < 1) {
          local_98 = -1;
        }
        else {
          local_98 = **(REF_GLOB **)(*(long *)(&ref_node_local->n + (long)i * 2) + 0x10);
        }
        global_pivot = local_98;
        while (local_40 < **(int **)(&ref_node_local->n + (long)i * 2)) {
          for (global._4_4_ = 0;
              global._4_4_ < *(int *)(*(long *)(&ref_node_local->n + (long)i * 2) + 8);
              global._4_4_ = global._4_4_ + 1) {
            *(undefined8 *)(&ref_private_macro_code_rss_1 + (long)global._4_4_ * 2) =
                 *(undefined8 *)
                  (*(long *)(*(long *)(&ref_node_local->n + (long)i * 2) + 0x18) +
                  (long)(global._4_4_ +
                        *(int *)(*(long *)(&ref_node_local->n + (long)i * 2) + 8) * local_40) * 8);
          }
          uVar1 = ref_cloud_store((REF_CLOUD)one_layer_local,global_pivot,
                                  (REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x3b3,"ref_recon_grow_cloud_one_layer",(ulong)uVar1,"store stencil increase");
            return uVar1;
          }
          local_40 = local_40 + 1;
          if ((local_40 < 0) || (**(int **)(&ref_node_local->n + (long)i * 2) <= local_40)) {
            local_a0 = -1;
          }
          else {
            local_a0 = *(REF_GLOB *)
                        (*(long *)(*(long *)(&ref_node_local->n + (long)i * 2) + 0x10) +
                        (long)local_40 * 8);
          }
          global_pivot = local_a0;
        }
      }
      add_index = add_index + 1;
      if ((add_index < 0) || (_pivot_index->n <= add_index)) {
        local_a8 = -NAN;
      }
      else {
        local_a8 = (REF_DBL)_pivot_index->global[add_index];
      }
      xyzs[3] = local_a8;
    }
    ref_cloud_free(_pivot_index);
    ref_cloud_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x3a6,
           "ref_recon_grow_cloud_one_layer",(ulong)uVar1,"copy");
    ref_cloud_local._4_4_ = uVar1;
  }
  return ref_cloud_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_recon_grow_cloud_one_layer(REF_CLOUD ref_cloud,
                                                         REF_CLOUD *one_layer,
                                                         REF_NODE ref_node) {
  REF_CLOUD copy;
  REF_STATUS ref_status;
  REF_INT pivot_index, local_pivot;
  REF_INT add_index, i;
  REF_GLOB global, global_pivot;
  REF_DBL xyzs[4];
  RSS(ref_cloud_deep_copy(&copy, ref_cloud), "copy");
  each_ref_cloud_global(copy, pivot_index, global_pivot) {
    ref_status = ref_node_local(ref_node, global_pivot, &local_pivot);
    if (REF_NOT_FOUND == ref_status) {
      printf("global %ld not found\n", global_pivot);
      continue;
    } else {
      RSS(ref_status, "local search");
    }
    each_ref_cloud_global(one_layer[local_pivot], add_index, global) {
      each_ref_cloud_aux(one_layer[local_pivot], i) {
        xyzs[i] = ref_cloud_aux(one_layer[local_pivot], i, add_index);
      }
      RSS(ref_cloud_store(ref_cloud, global, xyzs), "store stencil increase");
    }
  }
  ref_cloud_free(copy);

  return REF_SUCCESS;
}